

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

objective_function * __thiscall
anon_unknown.dwarf_f00bc::preprocessor<baryonyx::problem>::objective_function_exclude_copy
          (objective_function *__return_storage_ptr__,preprocessor<baryonyx::problem> *this,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  pointer poVar8;
  pointer poVar9;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_88;
  int local_7c;
  objective_function_element *local_78;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_70;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  local_68;
  __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
  it;
  anon_class_4_1_54a39809_for__M_pred local_58;
  int e_2;
  int i_2;
  value_type vb;
  value_type va;
  int e_1;
  int i_1;
  int local_28;
  int e;
  int i;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *mapping_local;
  preprocessor<baryonyx::problem> *this_local;
  objective_function *ret;
  
  baryonyx::objective_function::objective_function(__return_storage_ptr__);
  __return_storage_ptr__->value = (this->pb->objective).value + (this->merge_obj).value;
  local_28 = 0;
  iVar3 = baryonyx::
          length<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                    (&(this->pb->objective).elements);
  for (; local_28 != iVar3; local_28 = local_28 + 1) {
    pvVar4 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&(this->pb->objective).elements,(long)local_28);
    pvVar5 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                       (mapping,(long)pvVar4->variable_index);
    if (pvVar5->first == -1) {
      pvVar4 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&(this->pb->objective).elements,(long)local_28);
      pvVar5 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                         (mapping,(long)pvVar4->variable_index);
      if ((pvVar5->second & 1U) != 0) {
        pvVar4 = std::
                 vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                 ::operator[](&(this->pb->objective).elements,(long)local_28);
        __return_storage_ptr__->value = pvVar4->factor + __return_storage_ptr__->value;
      }
    }
    else {
      pvVar4 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&(this->pb->objective).elements,(long)local_28);
      pvVar6 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&(this->pb->objective).elements,(long)local_28);
      pvVar5 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                         (mapping,(long)pvVar6->variable_index);
      std::
      vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
      ::emplace_back<double_const&,int_const&>
                ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                  *)__return_storage_ptr__,&pvVar4->factor,&pvVar5->first);
    }
  }
  va.second = false;
  va._5_3_ = 0;
  iVar3 = baryonyx::
          length<std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>
                    (&(this->pb->objective).qelements);
  for (; va._4_4_ != iVar3; va._4_4_ = va._4_4_ + 1) {
    pvVar7 = std::
             vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
    pvVar5 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                       (mapping,(long)pvVar7->variable_index_a);
    vb = *pvVar5;
    pvVar7 = std::
             vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
    pvVar5 = std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::operator[]
                       (mapping,(long)pvVar7->variable_index_b);
    _e_2 = *pvVar5;
    if (vb.first == -1) {
      if (e_2 == -1) {
        if ((((ulong)vb & 0x100000000) != 0) && (((ulong)_e_2 & 0x100000000) != 0)) {
          pvVar7 = std::
                   vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
          __return_storage_ptr__->value = pvVar7->factor + __return_storage_ptr__->value;
        }
      }
      else {
        pvVar7 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
        std::
        vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
        ::emplace_back<double_const&,int&>
                  ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                    *)__return_storage_ptr__,&pvVar7->factor,&e_2);
      }
    }
    else if (e_2 == -1) {
      pvVar7 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
      std::
      vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
      ::emplace_back<double_const&,int&>
                ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                  *)__return_storage_ptr__,&pvVar7->factor,&vb.first);
    }
    else {
      pvVar7 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&(this->pb->objective).qelements,(long)(int)va._4_4_);
      std::
      vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
      ::emplace_back<double_const&,int&,int&>
                ((vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>
                  *)&__return_storage_ptr__->qelements,&pvVar7->factor,&vb.first,&e_2);
    }
  }
  local_58.i = 0;
  it._M_current._4_4_ =
       baryonyx::
       length<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                 (&(this->merge_obj).elements);
  for (; local_58.i != it._M_current._4_4_; local_58.i = local_58.i + 1) {
    local_70._M_current =
         (objective_function_element *)
         std::
         begin<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                   (&__return_storage_ptr__->elements);
    local_78 = (objective_function_element *)
               std::
               end<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                         (&__return_storage_ptr__->elements);
    local_7c = local_58.i;
    local_68 = std::
               find_if<__gnu_cxx::__normal_iterator<baryonyx::objective_function_element*,std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>,(anonymous_namespace)::preprocessor<baryonyx::problem>::objective_function_exclude_copy(std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>const&)const::_lambda(auto:1_const&)_1_>
                         (local_70,(__normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                                    )local_78,local_58);
    local_88._M_current =
         (objective_function_element *)
         std::
         end<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                   (&__return_storage_ptr__->elements);
    bVar2 = __gnu_cxx::
            operator==<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                      (&local_68,&local_88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      poVar8 = __gnu_cxx::
               __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
               ::operator->(&local_68);
      poVar9 = __gnu_cxx::
               __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
               ::operator->(&local_68);
      std::
      vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
      ::emplace_back<double&,int&>
                ((vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>
                  *)__return_storage_ptr__,&poVar8->factor,&poVar9->variable_index);
    }
    else {
      pvVar4 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&(this->merge_obj).elements,(long)local_58.i);
      dVar1 = pvVar4->factor;
      poVar8 = __gnu_cxx::
               __normal_iterator<baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
               ::operator->(&local_68);
      poVar8->factor = dVar1 + poVar8->factor;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto objective_function_exclude_copy(
      const std::vector<std::pair<int, bool>>& mapping) const
      -> bx::objective_function
    {
        bx::objective_function ret;

        ret.value = pb.objective.value + merge_obj.value;

        for (int i = 0, e = bx::length(pb.objective.elements); i != e; ++i) {
            if (mapping[pb.objective.elements[i].variable_index].first == -1) {
                if (mapping[pb.objective.elements[i].variable_index].second)
                    ret.value += pb.objective.elements[i].factor;
            } else {
                ret.elements.emplace_back(
                  pb.objective.elements[i].factor,
                  mapping[pb.objective.elements[i].variable_index].first);
            }
        }

        for (int i = 0, e = bx::length(pb.objective.qelements); i != e; ++i) {
            auto va = mapping[pb.objective.qelements[i].variable_index_a];
            auto vb = mapping[pb.objective.qelements[i].variable_index_b];

            if (va.first == -1) {
                if (vb.first == -1) {
                    if (va.second && vb.second)
                        ret.value += pb.objective.qelements[i].factor;
                } else {
                    ret.elements.emplace_back(pb.objective.qelements[i].factor,
                                              vb.first);
                }
            } else {
                if (vb.first == -1) {
                    ret.elements.emplace_back(pb.objective.qelements[i].factor,
                                              va.first);
                } else {
                    ret.qelements.emplace_back(
                      pb.objective.qelements[i].factor, va.first, vb.first);
                }
            }
        }

        for (int i = 0, e = length(merge_obj.elements); i != e; ++i) {
            auto it = std::find_if(
              std::begin(ret.elements),
              std::end(ret.elements),
              [i](const auto& elem) { return i == elem.variable_index; });

            if (it != std::end(ret.elements))
                it->factor += merge_obj.elements[i].factor;
            else
                ret.elements.emplace_back(it->factor, it->variable_index);
        }

        return ret;
    }